

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O3

bool __thiscall
crnlib::clusterizer<crnlib::vec<2U,_float>_>::generate_codebook
          (clusterizer<crnlib::vec<2U,_float>_> *this,uint max_size,
          progress_callback_func_ptr pProgress_callback,void *pProgress_data,bool quick)

{
  node_vec_type *this_00;
  vector<unsigned_int> *this_01;
  vector<unsigned_int> *this_02;
  vector<unsigned_int> *this_03;
  uint *puVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  uint uVar5;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar6;
  void *p;
  vq_node *pvVar7;
  uint *puVar8;
  vec<2U,_float> *p_00;
  float fVar9;
  bool bVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  vq_node *pvVar17;
  long lVar18;
  float fVar19;
  float local_78;
  float fStack_74;
  ulong uStack_70;
  vector<unsigned_int> local_60;
  undefined5 local_50;
  undefined3 uStack_4b;
  undefined4 local_48;
  undefined1 local_44;
  void *local_38;
  
  uVar5 = (this->m_training_vecs).m_size;
  if (uVar5 == 0) {
    return false;
  }
  this->m_quick = quick;
  local_60.m_p = (uint *)0x0;
  local_60.m_size = 0;
  local_60.m_capacity = 0;
  local_78 = 0.0;
  fStack_74 = 0.0;
  uStack_70 = 0;
  local_50 = 0xffffffffff;
  uStack_4b = 0xffffff;
  local_48 = 0xffffffff;
  local_44 = 0;
  local_38 = pProgress_data;
  vector<unsigned_int>::reserve(&local_60,uVar5);
  if ((this->m_training_vecs).m_size == 0) {
    fVar9 = 0.0;
  }
  else {
    fVar9 = 0.0;
    lVar18 = 0;
    uVar15 = 0;
    do {
      ppVar6 = (this->m_training_vecs).m_p;
      uVar12 = (ulong)*(uint *)((long)(&ppVar6->first + 1) + lVar18);
      fVar19 = (float)uVar12;
      uVar4 = *(undefined8 *)((long)(ppVar6->first).m_s + lVar18);
      local_78 = local_78 + fVar19 * (float)uVar4;
      fStack_74 = fStack_74 + fVar19 * (float)((ulong)uVar4 >> 0x20);
      uStack_70 = uStack_70 + uVar12;
      if (local_60.m_capacity <= local_60.m_size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&local_60,local_60.m_size + 1,true,4,(object_mover)0x0,false)
        ;
      }
      local_60.m_p[local_60.m_size] = (uint)uVar15;
      local_60.m_size = local_60.m_size + 1;
      fVar2 = *(float *)((long)(ppVar6->first).m_s + lVar18);
      fVar3 = *(float *)((long)(ppVar6->first).m_s + lVar18 + 4);
      fVar9 = fVar9 + (fVar3 * fVar3 + fVar2 * fVar2) * fVar19;
      uVar15 = uVar15 + 1;
      lVar18 = lVar18 + 0xc;
    } while (uVar15 < (this->m_training_vecs).m_size);
  }
  fVar19 = 1.0 / (float)uStack_70;
  this_00 = &this->m_nodes;
  pvVar17 = (this->m_nodes).m_p;
  if (pvVar17 != (vq_node *)0x0) {
    uVar15 = (ulong)(this->m_nodes).m_size;
    if (uVar15 != 0) {
      lVar18 = 0;
      do {
        p = *(void **)((long)&((vector<unsigned_int> *)(&pvVar17->m_centroid + 3))->m_p + lVar18);
        if (p != (void *)0x0) {
          crnlib_free(p);
        }
        lVar18 = lVar18 + 0x38;
      } while (uVar15 * 0x38 - lVar18 != 0);
      pvVar17 = this_00->m_p;
    }
    crnlib_free(pvVar17);
    this_00->m_p = (vq_node *)0x0;
    (this->m_nodes).m_size = 0;
    (this->m_nodes).m_capacity = 0;
  }
  vector<crnlib::clusterizer<crnlib::vec<2U,_float>_>::vq_node>::reserve(this_00,max_size * 2 + 1);
  uVar13 = (this->m_nodes).m_size;
  if ((this->m_nodes).m_capacity <= uVar13) {
    elemental_vector::increase_capacity
              ((elemental_vector *)this_00,uVar13 + 1,true,0x38,
               vector<crnlib::clusterizer<crnlib::vec<2U,_float>_>::vq_node>::object_mover,false);
    uVar13 = (this->m_nodes).m_size;
  }
  pvVar7 = this_00->m_p;
  pvVar17 = pvVar7 + uVar13;
  (pvVar17->m_centroid).m_s[0] = fVar19 * local_78;
  (pvVar17->m_centroid).m_s[1] = fVar19 * fStack_74;
  pvVar17->m_total_weight = uStack_70;
  pvVar17->m_variance = fVar9 - (fStack_74 * fStack_74 + local_78 * local_78) / (float)uStack_70;
  (pvVar17->m_vectors).m_p = (uint *)0x0;
  (pvVar17->m_vectors).m_size = 0;
  (pvVar17->m_vectors).m_capacity = 0;
  elemental_vector::increase_capacity
            ((elemental_vector *)&pvVar17->m_vectors,local_60.m_size,false,4,(object_mover)0x0,false
            );
  pvVar7[uVar13].m_vectors.m_size = local_60.m_size;
  memcpy(pvVar7[uVar13].m_vectors.m_p,local_60.m_p,(ulong)local_60.m_size << 2);
  pvVar7[uVar13].m_left = (int)local_50;
  pvVar7[uVar13].m_right = (int)(CONCAT35(uStack_4b,local_50) >> 0x20);
  *(ulong *)((long)&pvVar7[uVar13].m_right + 1) = CONCAT17(local_44,CONCAT43(local_48,uStack_4b));
  puVar1 = &(this->m_nodes).m_size;
  *puVar1 = *puVar1 + 1;
  this_01 = &this->m_heap;
  uVar13 = max_size + 1;
  uVar14 = (this->m_heap).m_size;
  if (uVar14 != uVar13) {
    if (uVar14 <= uVar13) {
      if ((this->m_heap).m_capacity < uVar13) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_01,uVar13,uVar14 == max_size,4,(object_mover)0x0,false);
        uVar14 = (this->m_heap).m_size;
      }
      memset(this_01->m_p + uVar14,0,(ulong)(uVar13 - uVar14) << 2);
    }
    (this->m_heap).m_size = uVar13;
  }
  (this->m_heap).m_p[1] = 0;
  this->m_heap_size = 1;
  this->m_split_index = 0;
  this_02 = &this->m_left_children;
  vector<unsigned_int>::reserve(this_02,(this->m_training_vecs).m_size + 1);
  this_03 = &this->m_right_children;
  vector<unsigned_int>::reserve(this_03,(this->m_training_vecs).m_size + 1);
  uVar14 = 1;
  uVar13 = 0xffffffff;
  do {
    if ((max_size <= uVar14) || (uVar11 = this->m_heap_size, uVar11 == 0)) {
LAB_00143903:
      p_00 = (this->m_codebook).m_p;
      if (p_00 != (vec<2U,_float> *)0x0) {
        crnlib_free(p_00);
        (this->m_codebook).m_p = (vec<2U,_float> *)0x0;
        (this->m_codebook).m_size = 0;
        (this->m_codebook).m_capacity = 0;
      }
      this->m_overall_variance = 0.0;
      uVar13 = (this->m_nodes).m_size;
      if (uVar13 != 0) {
        lVar18 = 0x30;
        uVar15 = 0;
        do {
          pvVar17 = this_00->m_p;
          if (*(int *)((long)(&pvVar17->m_centroid + -1) + lVar18) == -1) {
            uVar13 = (this->m_codebook).m_size;
            *(uint *)((long)(pvVar17->m_centroid).m_s + lVar18) = uVar13;
            if ((this->m_codebook).m_capacity <= uVar13) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)&this->m_codebook,uVar13 + 1,true,8,(object_mover)0x0,
                         false);
              uVar13 = (this->m_codebook).m_size;
            }
            *(undefined8 *)(this->m_codebook).m_p[uVar13].m_s =
                 *(undefined8 *)((long)(&pvVar17->m_centroid + -6) + lVar18);
            puVar1 = &(this->m_codebook).m_size;
            *puVar1 = *puVar1 + 1;
            this->m_overall_variance =
                 *(float *)((long)(&pvVar17->m_centroid + -4) + lVar18) + this->m_overall_variance;
            uVar13 = (this->m_nodes).m_size;
          }
          uVar15 = uVar15 + 1;
          lVar18 = lVar18 + 0x38;
        } while (uVar15 < uVar13);
      }
      if (this_01->m_p != (uint *)0x0) {
        crnlib_free(this_01->m_p);
        this_01->m_p = (uint *)0x0;
        (this->m_heap).m_size = 0;
        (this->m_heap).m_capacity = 0;
      }
      if (this_02->m_p != (uint *)0x0) {
        crnlib_free(this_02->m_p);
        this_02->m_p = (uint *)0x0;
        (this->m_left_children).m_size = 0;
        (this->m_left_children).m_capacity = 0;
      }
      bVar10 = true;
      if (this_03->m_p != (uint *)0x0) {
        crnlib_free(this_03->m_p);
        this_03->m_p = (uint *)0x0;
        (this->m_right_children).m_size = 0;
        (this->m_right_children).m_capacity = 0;
      }
      goto LAB_001439fe;
    }
    uVar16 = uVar14 * 100 + (max_size >> 1) + 100;
    while( true ) {
      uVar14 = uVar14 + 1;
      puVar8 = (this->m_heap).m_p;
      uVar5 = puVar8[1];
      puVar8[1] = puVar8[uVar11];
      puVar1 = &this->m_heap_size;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 != 0) {
        down_heap(this,1);
      }
      split_node(this,uVar5);
      if (((uVar14 & 0x3f) == 0 && pProgress_callback != (progress_callback_func_ptr)0x0) &&
         (uVar11 = uVar16 / max_size, uVar11 != uVar13)) break;
      if (max_size <= uVar14) goto LAB_00143903;
      uVar16 = uVar16 + 100;
      uVar11 = this->m_heap_size;
      if (uVar11 == 0) goto LAB_00143903;
    }
    bVar10 = (*pProgress_callback)(uVar11,local_38);
    uVar13 = uVar11;
  } while (bVar10);
  bVar10 = false;
LAB_001439fe:
  if (local_60.m_p == (uint *)0x0) {
    return bVar10;
  }
  crnlib_free(local_60.m_p);
  return bVar10;
}

Assistant:

bool generate_codebook(uint max_size, progress_callback_func_ptr pProgress_callback = nullptr, void* pProgress_data = nullptr, bool quick = false)
        {
            if (m_training_vecs.empty())
            {
                return false;
            }

            m_quick = quick;

            double ttsum = 0.0f;

            vq_node root;
            root.m_vectors.reserve(m_training_vecs.size());

            for (uint i = 0; i < m_training_vecs.size(); i++)
            {
                const VectorType& v = m_training_vecs[i].first;
                const uint weight = m_training_vecs[i].second;

                root.m_centroid += (v * (float)weight);
                root.m_total_weight += weight;
                root.m_vectors.push_back(i);

                ttsum += v.dot(v) * weight;
            }

            root.m_variance = (float)(ttsum - (root.m_centroid.dot(root.m_centroid) / root.m_total_weight));

            root.m_centroid *= (1.0f / root.m_total_weight);

            m_nodes.clear();
            m_nodes.reserve(max_size * 2 + 1);

            m_nodes.push_back(root);

            m_heap.resize(max_size + 1);
            m_heap[1] = 0;
            m_heap_size = 1;

            m_split_index = 0;

            uint total_leaves = 1;

            m_left_children.reserve(m_training_vecs.size() + 1);
            m_right_children.reserve(m_training_vecs.size() + 1);

            int prev_percentage = -1;
            while ((total_leaves < max_size) && (m_heap_size))
            {
                int worst_node_index = m_heap[1];

                m_heap[1] = m_heap[m_heap_size];
                m_heap_size--;
                if (m_heap_size)
                {
                    down_heap(1);
                }

                split_node(worst_node_index);
                total_leaves++;

                if ((pProgress_callback) && ((total_leaves & 63) == 0) && (max_size))
                {
                    int cur_percentage = (total_leaves * 100U + (max_size / 2U)) / max_size;
                    if (cur_percentage != prev_percentage)
                    {
                        if (!(*pProgress_callback)(cur_percentage, pProgress_data))
                        {
                            return false;
                        }

                        prev_percentage = cur_percentage;
                    }
                }
            }

            m_codebook.clear();

            m_overall_variance = 0.0f;

            for (uint i = 0; i < m_nodes.size(); i++)
            {
                vq_node& node = m_nodes[i];
                if (node.m_left != -1)
                {
                    CRNLIB_ASSERT(node.m_right != -1);
                    continue;
                }

                CRNLIB_ASSERT((node.m_left == -1) && (node.m_right == -1));

                node.m_codebook_index = m_codebook.size();
                m_codebook.push_back(node.m_centroid);

                m_overall_variance += node.m_variance;
            }

            m_heap.clear();
            m_left_children.clear();
            m_right_children.clear();

            return true;
        }